

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSSetJacTimesRhsFn(void *arkode_mem,ARKRhsFn jtimesRhsFn)

{
  int iVar1;
  ARKRhsFn p_Var2;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSSetJacTimesRhsFn",&ark_mem,&arkls_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (arkls_mem->jtimesDQ == 0) {
    msgfmt = "Internal finite-difference Jacobian-vector product is disabled.";
  }
  else {
    if (jtimesRhsFn != (ARKRhsFn)0x0) {
      arkls_mem->Jt_f = jtimesRhsFn;
      return 0;
    }
    p_Var2 = (*ark_mem->step_getimplicitrhs)(arkode_mem);
    arkls_mem->Jt_f = p_Var2;
    if (p_Var2 != (ARKRhsFn)0x0) {
      return 0;
    }
    msgfmt = "Time step module is missing implicit RHS fcn";
  }
  arkProcessError(ark_mem,-3,"ARKLS","arkLSSetJacTimesRhsFn",msgfmt);
  return -3;
}

Assistant:

int arkLSSetJacTimesRhsFn(void *arkode_mem, ARKRhsFn jtimesRhsFn)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetJacTimesRhsFn",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* check if using internal finite difference approximation */
  if (!(arkls_mem->jtimesDQ)) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS", "arkLSSetJacTimesRhsFn",
                    "Internal finite-difference Jacobian-vector product is disabled.");
    return(ARKLS_ILL_INPUT);
  }

  /* store function pointers for RHS function (NULL implies use ODE RHS) */
  if (jtimesRhsFn != NULL) {
    arkls_mem->Jt_f = jtimesRhsFn;
  } else {
    arkls_mem->Jt_f = ark_mem->step_getimplicitrhs(arkode_mem);

    if (arkls_mem->Jt_f == NULL) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLSSetJacTimesRhsFn",
                      "Time step module is missing implicit RHS fcn");
      return(ARKLS_ILL_INPUT);
    }
  }

  return(ARKLS_SUCCESS);
}